

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

ssize_t uv__recvmsg(int fd,msghdr *msg,int flags)

{
  int *piVar1;
  ssize_t rc;
  int flags_local;
  msghdr *msg_local;
  long lStack_10;
  int fd_local;
  
  lStack_10 = recvmsg(fd,(msghdr *)msg,flags | 0x40000000);
  if (lStack_10 == -1) {
    piVar1 = __errno_location();
    lStack_10 = (long)-*piVar1;
  }
  return lStack_10;
}

Assistant:

ssize_t uv__recvmsg(int fd, struct msghdr* msg, int flags) {
#if defined(__ANDROID__)   || \
    defined(__DragonFly__) || \
    defined(__FreeBSD__)   || \
    defined(__NetBSD__)    || \
    defined(__OpenBSD__)   || \
    defined(__linux__)
  ssize_t rc;
  rc = recvmsg(fd, msg, flags | MSG_CMSG_CLOEXEC);
  if (rc == -1)
    return UV__ERR(errno);
  return rc;
#else
  struct cmsghdr* cmsg;
  int* pfd;
  int* end;
  ssize_t rc;
  rc = recvmsg(fd, msg, flags);
  if (rc == -1)
    return UV__ERR(errno);
  if (msg->msg_controllen == 0)
    return rc;
  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg))
    if (cmsg->cmsg_type == SCM_RIGHTS)
      for (pfd = (int*) CMSG_DATA(cmsg),
           end = (int*) ((char*) cmsg + cmsg->cmsg_len);
           pfd < end;
           pfd += 1)
        uv__cloexec(*pfd, 1);
  return rc;
#endif
}